

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# water.cpp
# Opt level: O3

shared_ptr<Histogram> runHistogramStage(Image *previous,WaterEffectOptions *options)

{
  pointer puVar1;
  long *plVar2;
  size_type *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<Histogram> sVar5;
  shared_ptr<Image> hist_img;
  string local_70;
  Image *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  getHistogram((Histogram *)&local_70,(Image *)options);
  puVar1 = (pointer)operator_new(0x30);
  puVar1[8] = '\x01';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\x01';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  *(undefined ***)puVar1 = &PTR___Sp_counted_ptr_inplace_0011bd28;
  *(pointer *)(puVar1 + 0x10) = local_70._M_dataplus._M_p;
  *(size_type *)(puVar1 + 0x18) = local_70._M_string_length;
  *(size_type *)(puVar1 + 0x20) = local_70.field_2._M_allocated_capacity;
  *(undefined8 *)(puVar1 + 0x28) = local_70.field_2._8_8_;
  (previous->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar1;
  previous->pixels = (Pixel *)(puVar1 + 0x10);
  _Var4._M_pi = extraout_RDX;
  if (in_RDX[1].field_2._M_local_buf[0] == '\x01') {
    Histogram::toImage((Histogram *)&local_50,(uint)(Pixel *)(puVar1 + 0x10));
    std::operator+(&local_40,"output/",in_RDX);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
    psVar3 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_70.field_2._M_allocated_capacity = *psVar3;
      local_70.field_2._8_8_ = plVar2[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar3;
      local_70._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_70._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    Image::toPNG(local_50,&local_70);
    _Var4._M_pi = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
      _Var4._M_pi = extraout_RDX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
      _Var4._M_pi = extraout_RDX_02;
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      _Var4._M_pi = extraout_RDX_03;
    }
  }
  sVar5.super___shared_ptr<Histogram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  sVar5.super___shared_ptr<Histogram,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)previous;
  return (shared_ptr<Histogram>)sVar5.super___shared_ptr<Histogram,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Histogram> runHistogramStage(const Image *previous, const WaterEffectOptions *options) {
  // Obtain the histogram
  auto hist = std::make_shared<Histogram>(getHistogram(previous));

  // Optionally save the intermediate histogram as an image
  if (options->save_intermediate) {
    auto hist_img = hist->toImage();
    hist_img->toPNG("output/" + options->img_name + "_histogram.png");
  }
  return hist;
}